

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float16_to_float64_arm(float16 a,_Bool ieee,float_status *s)

{
  FloatFmt *params;
  float64 fVar1;
  FloatParts FVar2;
  FloatParts pr;
  FloatParts p;
  FloatFmt *fmt16;
  float_status *s_local;
  _Bool ieee_local;
  float16 a_local;
  
  params = &float16_params_ahp;
  if (ieee) {
    params = &float16_params;
  }
  FVar2 = float16a_unpack_canonical(a,s,params);
  FVar2 = float_to_float(FVar2,&float64_params,s);
  fVar1 = float64_round_pack_canonical(FVar2,s);
  return fVar1;
}

Assistant:

float64 float16_to_float64(float16 a, bool ieee, float_status *s)
{
    const FloatFmt *fmt16 = ieee ? &float16_params : &float16_params_ahp;
    FloatParts p = float16a_unpack_canonical(a, s, fmt16);
    FloatParts pr = float_to_float(p, &float64_params, s);
    return float64_round_pack_canonical(pr, s);
}